

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  TestStatus *pTVar1;
  DeviceInterface *vk;
  VkDevice device;
  deUint32 dVar2;
  Unique<vk::Handle<(vk::HandleType)7>_> obj2;
  Unique<vk::Handle<(vk::HandleType)7>_> obj3;
  Unique<vk::Handle<(vk::HandleType)7>_> obj1;
  Unique<vk::Handle<(vk::HandleType)7>_> obj0;
  VkMemoryAllocateInfo local_108;
  Move<vk::Handle<(vk::HandleType)7>_> local_e8;
  TestStatus *local_c0;
  Move<vk::Handle<(vk::HandleType)7>_> local_b8;
  Move<vk::Handle<(vk::HandleType)7>_> local_98;
  VkDeviceMemory local_78;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)7>_> local_50;
  
  dVar2 = (deUint32)params.size;
  local_c0 = __return_storage_ptr__;
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  local_108.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.allocationSize = (VkDeviceSize)context;
  local_108.memoryTypeIndex = dVar2;
  ::vk::allocateMemory(&local_98,vk,device,&local_108,(VkAllocationCallbacks *)0x0);
  local_78.m_internal =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  DStack_70.m_deviceIface =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  DStack_70.m_device =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  DStack_70.m_allocator =
       local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_108.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.allocationSize = (VkDeviceSize)context;
  local_108.memoryTypeIndex = dVar2;
  ::vk::allocateMemory(&local_e8,vk,device,&local_108,(VkAllocationCallbacks *)0x0);
  local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_108.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.allocationSize = (VkDeviceSize)context;
  local_108.memoryTypeIndex = dVar2;
  ::vk::allocateMemory(&local_b8,vk,device,&local_108,(VkAllocationCallbacks *)0x0);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_108.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_108.pNext = (void *)0x0;
  local_108.allocationSize = (VkDeviceSize)context;
  local_108.memoryTypeIndex = dVar2;
  ::vk::allocateMemory(&local_50,vk,device,&local_108,(VkAllocationCallbacks *)0x0);
  pTVar1 = local_c0;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  if (local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  if (local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_98.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_70,local_78);
  }
  local_108._0_8_ = &local_108.allocationSize;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_108._0_8_,
             (long)local_108.pNext + local_108._0_8_);
  if ((VkDeviceSize *)local_108._0_8_ != &local_108.allocationSize) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)(TestContext **)local_108.allocationSize + 1));
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}